

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O0

void __thiscall TcpServer::~TcpServer(TcpServer *this)

{
  TcpServer *this_local;
  
  std::function<void_()>::~function(&this->ts_close_cb);
  std::function<void_(const_std::shared_ptr<TcpConnection>_&,_InputBuffer_*)>::~function
            (&this->ts_message_cb);
  std::function<void_(const_std::shared_ptr<TcpConnection>_&,_InputBuffer_*)>::~function
            (&this->ts_msg_cb);
  std::function<void_(const_std::shared_ptr<TcpConnection>_&)>::~function(&this->ts_connected_cb);
  std::vector<std::shared_ptr<TcpConnection>,_std::allocator<std::shared_ptr<TcpConnection>_>_>::
  ~vector(&this->ts_tcp_connections);
  Timer::~Timer(&this->ts_timer);
  std::unique_ptr<Threadpool,_std::default_delete<Threadpool>_>::~unique_ptr(&this->ts_thread_pool);
  std::vector<EventLoop_*,_std::allocator<EventLoop_*>_>::~vector(&this->ts_conn_loops);
  std::unique_ptr<Acceptor,_std::default_delete<Acceptor>_>::~unique_ptr(&this->ts_acceptor);
  return;
}

Assistant:

TcpServer::~TcpServer() {

}